

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_shared_code_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::SharedCodeGenerator::GenerateDescriptors
          (SharedCodeGenerator *this,Printer *printer)

{
  SourceCodeInfo *this_00;
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  FileDescriptor *pFVar4;
  string *psVar5;
  ClassNameResolver *this_01;
  size_type sVar6;
  reference pvVar7;
  undefined1 immutable;
  string *dependency;
  undefined1 local_268 [4];
  int i_2;
  string local_228;
  string local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  undefined1 local_1c8 [8];
  string classname;
  string filename;
  undefined1 local_180 [4];
  int i_1;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  dependencies;
  string local_148;
  int local_124;
  undefined1 local_120 [4];
  int i;
  string file_data;
  undefined1 local_f0 [8];
  FileDescriptorProto file_proto;
  Printer *printer_local;
  SharedCodeGenerator *this_local;
  
  file_proto.source_code_info_ = (SourceCodeInfo *)printer;
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_f0);
  FileDescriptor::CopyTo(this->file_,(FileDescriptorProto *)local_f0);
  std::__cxx11::string::string((string *)local_120);
  MessageLite::SerializeToString((MessageLite *)local_f0,(string *)local_120);
  io::Printer::Print((Printer *)file_proto.source_code_info_,
                     "java.lang.String[] descriptorData = {\n");
  io::Printer::Indent((Printer *)file_proto.source_code_info_);
  for (local_124 = 0; uVar2 = (ulong)local_124, uVar3 = std::__cxx11::string::size(), uVar2 < uVar3;
      local_124 = local_124 + 0x28) {
    if (0 < local_124) {
      if (local_124 % 400 == 0) {
        io::Printer::Print((Printer *)file_proto.source_code_info_,",\n");
      }
      else {
        io::Printer::Print((Printer *)file_proto.source_code_info_," +\n");
      }
    }
    this_00 = file_proto.source_code_info_;
    std::__cxx11::string::substr
              ((ulong)&dependencies.
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_120);
    CEscape(&local_148,
            (string *)
            &dependencies.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage);
    io::Printer::Print((Printer *)this_00,"\"$data$\"","data",&local_148);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string
              ((string *)
               &dependencies.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  io::Printer::Outdent((Printer *)file_proto.source_code_info_);
  io::Printer::Print((Printer *)file_proto.source_code_info_,"\n};\n");
  io::Printer::Print((Printer *)file_proto.source_code_info_,
                     "com.google.protobuf.Descriptors.FileDescriptor.InternalDescriptorAssigner assigner =\n    new com.google.protobuf.Descriptors.FileDescriptor.    InternalDescriptorAssigner() {\n      public com.google.protobuf.ExtensionRegistry assignDescriptors(\n          com.google.protobuf.Descriptors.FileDescriptor root) {\n        descriptor = root;\n        return null;\n      }\n    };\n"
                    );
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_180);
  filename.field_2._12_4_ = 0;
  while( true ) {
    iVar1 = FileDescriptor::dependency_count(this->file_);
    immutable = (undefined1)iVar1;
    if (iVar1 <= (int)filename.field_2._12_4_) break;
    pFVar4 = FileDescriptor::dependency(this->file_,filename.field_2._12_4_);
    psVar5 = FileDescriptor::name_abi_cxx11_(pFVar4);
    std::__cxx11::string::string((string *)(classname.field_2._M_local_buf + 8),(string *)psVar5);
    pFVar4 = FileDescriptor::dependency(this->file_,filename.field_2._12_4_);
    FileJavaPackage_abi_cxx11_(&local_208,(java *)pFVar4,(FileDescriptor *)0x1,(bool)immutable);
    std::operator+(&local_1e8,&local_208,".");
    this_01 = internal::scoped_ptr<google::protobuf::compiler::java::ClassNameResolver>::operator->
                        (&this->name_resolver_);
    pFVar4 = FileDescriptor::dependency(this->file_,filename.field_2._12_4_);
    ClassNameResolver::GetDescriptorClassName_abi_cxx11_(&local_228,this_01,pFVar4);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8,
                   &local_1e8,&local_228);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_208);
    std::make_pair<std::__cxx11::string&,std::__cxx11::string&>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_268,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&classname.field_2 + 8),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::push_back((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_180,(value_type *)local_268);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_268);
    std::__cxx11::string::~string((string *)local_1c8);
    std::__cxx11::string::~string((string *)(classname.field_2._M_local_buf + 8));
    filename.field_2._12_4_ = filename.field_2._12_4_ + 1;
  }
  io::Printer::Print((Printer *)file_proto.source_code_info_,
                     "com.google.protobuf.Descriptors.FileDescriptor\n  .internalBuildGeneratedFileFrom(descriptorData,\n"
                    );
  io::Printer::Print((Printer *)file_proto.source_code_info_,
                     "    new com.google.protobuf.Descriptors.FileDescriptor[] {\n");
  for (dependency._4_4_ = 0;
      sVar6 = std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::size((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_180), (ulong)(long)dependency._4_4_ < sVar6;
      dependency._4_4_ = dependency._4_4_ + 1) {
    pvVar7 = std::
             vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_180,(long)dependency._4_4_);
    io::Printer::Print((Printer *)file_proto.source_code_info_,
                       "      $dependency$.getDescriptor(),\n","dependency",&pvVar7->second);
  }
  io::Printer::Print((Printer *)file_proto.source_code_info_,"    }, assigner);\n");
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)local_180);
  std::__cxx11::string::~string((string *)local_120);
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_f0);
  return;
}

Assistant:

void SharedCodeGenerator::GenerateDescriptors(io::Printer* printer) {
  // Embed the descriptor.  We simply serialize the entire FileDescriptorProto
  // and embed it as a string literal, which is parsed and built into real
  // descriptors at initialization time.  We unfortunately have to put it in
  // a string literal, not a byte array, because apparently using a literal
  // byte array causes the Java compiler to generate *instructions* to
  // initialize each and every byte of the array, e.g. as if you typed:
  //   b[0] = 123; b[1] = 456; b[2] = 789;
  // This makes huge bytecode files and can easily hit the compiler's internal
  // code size limits (error "code to large").  String literals are apparently
  // embedded raw, which is what we want.
  FileDescriptorProto file_proto;
  file_->CopyTo(&file_proto);

  string file_data;
  file_proto.SerializeToString(&file_data);

  printer->Print(
    "java.lang.String[] descriptorData = {\n");
  printer->Indent();

  // Only write 40 bytes per line.
  static const int kBytesPerLine = 40;
  for (int i = 0; i < file_data.size(); i += kBytesPerLine) {
    if (i > 0) {
      // Every 400 lines, start a new string literal, in order to avoid the
      // 64k length limit.
      if (i % 400 == 0) {
        printer->Print(",\n");
      } else {
        printer->Print(" +\n");
      }
    }
    printer->Print("\"$data$\"",
      "data", CEscape(file_data.substr(i, kBytesPerLine)));
  }

  printer->Outdent();
  printer->Print("\n};\n");

  // -----------------------------------------------------------------
  // Create the InternalDescriptorAssigner.

  printer->Print(
    "com.google.protobuf.Descriptors.FileDescriptor."
    "InternalDescriptorAssigner assigner =\n"
    "    new com.google.protobuf.Descriptors.FileDescriptor."
    "    InternalDescriptorAssigner() {\n"
    "      public com.google.protobuf.ExtensionRegistry assignDescriptors(\n"
    "          com.google.protobuf.Descriptors.FileDescriptor root) {\n"
    "        descriptor = root;\n"
    // Custom options will be handled when immutable messages' outer class is
    // loaded. Here we just return null and let custom options be unknown
    // fields.
    "        return null;\n"
    "      }\n"
    "    };\n");

  // -----------------------------------------------------------------
  // Find out all dependencies.
  std::vector<std::pair<string, string> > dependencies;
  for (int i = 0; i < file_->dependency_count(); i++) {
    string filename = file_->dependency(i)->name();
    string classname = FileJavaPackage(file_->dependency(i)) + "." +
                       name_resolver_->GetDescriptorClassName(
                           file_->dependency(i));
    dependencies.push_back(std::make_pair(filename, classname));
  }

  // -----------------------------------------------------------------
  // Invoke internalBuildGeneratedFileFrom() to build the file.
  printer->Print(
    "com.google.protobuf.Descriptors.FileDescriptor\n"
    "  .internalBuildGeneratedFileFrom(descriptorData,\n");
  printer->Print(
    "    new com.google.protobuf.Descriptors.FileDescriptor[] {\n");

  for (int i = 0; i < dependencies.size(); i++) {
    const string& dependency = dependencies[i].second;
    printer->Print(
        "      $dependency$.getDescriptor(),\n",
        "dependency", dependency);
  }

  printer->Print(
    "    }, assigner);\n");
}